

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O0

int Saig_ManVerifyCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  Vec_Ptr_t *p_00;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *pAVar8;
  int local_40;
  int local_3c;
  int iBit;
  int k;
  int i;
  int RetValue;
  Aig_Obj_t *pObjRo;
  Aig_Obj_t *pObjRi;
  Aig_Obj_t *pObj;
  Abc_Cex_t *p_local;
  Aig_Man_t *pAig_local;
  
  local_40 = 0;
  Aig_ManCleanMarkB(pAig);
  pAVar6 = Aig_ManConst1(pAig);
  *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffdf | 0x20;
  for (iBit = 0; iVar3 = Saig_ManRegNum(pAig), iBit < iVar3; iBit = iBit + 1) {
    p_00 = pAig->vCis;
    iVar3 = Saig_ManPiNum(pAig);
    pvVar7 = Vec_PtrEntry(p_00,iBit + iVar3);
    uVar5 = Abc_InfoHasBit((uint *)(p + 1),local_40);
    *(ulong *)((long)pvVar7 + 0x18) =
         *(ulong *)((long)pvVar7 + 0x18) & 0xffffffffffffffdf | ((ulong)uVar5 & 1) << 5;
    local_40 = local_40 + 1;
  }
  for (iBit = 0; iBit <= p->iFrame; iBit = iBit + 1) {
    for (local_3c = 0; iVar3 = Saig_ManPiNum(pAig), local_3c < iVar3; local_3c = local_3c + 1) {
      pvVar7 = Vec_PtrEntry(pAig->vCis,local_3c);
      uVar5 = Abc_InfoHasBit((uint *)(p + 1),local_40);
      *(ulong *)((long)pvVar7 + 0x18) =
           *(ulong *)((long)pvVar7 + 0x18) & 0xffffffffffffffdf | ((ulong)uVar5 & 1) << 5;
      local_40 = local_40 + 1;
    }
    for (local_3c = 0; iVar3 = Vec_PtrSize(pAig->vObjs), local_3c < iVar3; local_3c = local_3c + 1)
    {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_3c);
      if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) {
        pAVar8 = Aig_ObjFanin0(pAVar6);
        uVar2 = *(ulong *)&pAVar8->field_0x18;
        uVar5 = Aig_ObjFaninC0(pAVar6);
        pAVar8 = Aig_ObjFanin1(pAVar6);
        uVar1 = *(ulong *)&pAVar8->field_0x18;
        uVar4 = Aig_ObjFaninC1(pAVar6);
        *(ulong *)&pAVar6->field_0x18 =
             *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffdf |
             ((ulong)(((uint)(uVar2 >> 5) & 1 ^ uVar5) & ((uint)(uVar1 >> 5) & 1 ^ uVar4)) & 1) << 5
        ;
      }
    }
    for (local_3c = 0; iVar3 = Vec_PtrSize(pAig->vCos), local_3c < iVar3; local_3c = local_3c + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_3c);
      pAVar8 = Aig_ObjFanin0(pAVar6);
      uVar2 = *(ulong *)&pAVar8->field_0x18;
      uVar5 = Aig_ObjFaninC0(pAVar6);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffdf |
           ((ulong)((uint)(uVar2 >> 5) & 1 ^ uVar5) & 1) << 5;
    }
    if (iBit == p->iFrame) break;
    for (local_3c = 0; iVar3 = Saig_ManRegNum(pAig), local_3c < iVar3; local_3c = local_3c + 1) {
      pAVar6 = Saig_ManLi(pAig,local_3c);
      pAVar8 = Saig_ManLo(pAig,local_3c);
      *(ulong *)&pAVar8->field_0x18 =
           *(ulong *)&pAVar8->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)(*(ulong *)&pAVar6->field_0x18 >> 5) & 1) << 5;
    }
  }
  if (local_40 == p->nBits) {
    pAVar6 = Aig_ManCo(pAig,p->iPo);
    uVar2 = *(ulong *)&pAVar6->field_0x18;
    Aig_ManCleanMarkB(pAig);
    return (uint)(uVar2 >> 5) & 1;
  }
  __assert_fail("iBit == p->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                ,0x12f,"int Saig_ManVerifyCex(Aig_Man_t *, Abc_Cex_t *)");
}

Assistant:

int Saig_ManVerifyCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == p->nBits );
    RetValue = Aig_ManCo(pAig, p->iPo)->fMarkB;
    Aig_ManCleanMarkB(pAig);
    return RetValue;
}